

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall CServer::Kick(CServer *this,int ClientID,char *pReason)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  IConsole *pIVar2;
  
  if (((uint)ClientID < 0x40) && (this->m_aClients[(uint)ClientID].m_State != 0)) {
    if (this->m_RconClientID == ClientID) {
      pIVar2 = this->m_pConsole;
      UNRECOVERED_JUMPTABLE = (pIVar2->super_IInterface)._vptr_IInterface[0x19];
      pcVar1 = "you can\'t kick yourself";
    }
    else {
      if (this->m_aClients[(uint)ClientID].m_Authed <= this->m_RconAuthLevel) {
        CNetServer::Drop(&this->m_NetServer,ClientID,pReason);
        return;
      }
      pIVar2 = this->m_pConsole;
      UNRECOVERED_JUMPTABLE = (pIVar2->super_IInterface)._vptr_IInterface[0x19];
      pcVar1 = "kick command denied";
    }
  }
  else {
    pIVar2 = this->m_pConsole;
    UNRECOVERED_JUMPTABLE = (pIVar2->super_IInterface)._vptr_IInterface[0x19];
    pcVar1 = "invalid client id to kick";
  }
  (*UNRECOVERED_JUMPTABLE)(pIVar2,0,"server",pcVar1,0);
  return;
}

Assistant:

void CServer::Kick(int ClientID, const char *pReason)
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CClient::STATE_EMPTY)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "invalid client id to kick");
		return;
	}
	else if(m_RconClientID == ClientID)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "you can't kick yourself");
 		return;
	}
	else if(m_aClients[ClientID].m_Authed > m_RconAuthLevel)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "kick command denied");
 		return;
	}

	m_NetServer.Drop(ClientID, pReason);
}